

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt.c
# Opt level: O0

int gopt(char **argv,option *options)

{
  bool bVar1;
  char *pcVar2;
  option *in_RSI;
  char *in_RDI;
  char *eq;
  uint j;
  uint i;
  uint option_index;
  uint expecting;
  uint doubledash;
  uint operand_count;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_14;
  
  local_14 = 1;
  bVar1 = false;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  while ((in_RSI[local_24].flags & 0x100) == 0) {
    in_RSI[local_24].argument = (char *)0x0;
    in_RSI[local_24].count = 0;
    local_24 = local_24 + 1;
  }
  in_RSI[local_24].short_name = '\0';
  in_RSI[local_24].long_name = (char *)0x0;
  in_RSI[local_24].argument = (char *)0x0;
  in_RSI[local_24].count = 0;
  local_24 = 1;
  do {
    if (*(long *)(in_RDI + (ulong)local_24 * 8) == 0) {
      if (local_1c != 0) {
        in_RSI[local_20].flags = local_1c >> 1 | in_RSI[local_20].flags;
        in_RSI[local_20].argument = (char *)0x0;
      }
      pcVar2 = in_RDI + (ulong)local_14 * 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      return local_14;
    }
    if (bVar1) {
      *(undefined8 *)(in_RDI + (ulong)local_14 * 8) = *(undefined8 *)(in_RDI + (ulong)local_24 * 8);
      local_14 = local_14 + 1;
    }
    else {
      if (local_1c != 0) {
        if (((**(char **)(in_RDI + (ulong)local_24 * 8) != '-') ||
            (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 1) == '\0')) ||
           ((in_RSI[local_20].flags & 4) == 0)) {
          in_RSI[local_20].flags = local_1c | in_RSI[local_20].flags;
          in_RSI[local_20].argument = *(char **)(in_RDI + (ulong)local_24 * 8);
          local_1c = 0;
          goto LAB_0010335b;
        }
        in_RSI[local_20].flags = local_1c >> 1 | in_RSI[local_20].flags;
        in_RSI[local_20].argument = (char *)0x0;
        local_1c = 0;
      }
      if (((**(char **)(in_RDI + (ulong)local_24 * 8) == '-') &&
          (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 1) == '-')) &&
         (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 2) == '\0')) {
        bVar1 = true;
      }
      else if ((**(char **)(in_RDI + (ulong)local_24 * 8) == '-') &&
              (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 1) == '-')) {
        pcVar2 = strchr((char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 2),0x3d);
        local_20 = long_option_get_index(in_RDI,in_RSI);
        in_RSI[local_20].count = in_RSI[local_20].count + 1;
        if (((in_RSI[local_20].flags & 0x100) != 0) && (in_RSI[local_20].long_name == (char *)0x0))
        {
          in_RSI[local_20].long_name = (char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 2);
        }
        if (pcVar2 == (char *)0x0) {
          if ((in_RSI[local_20].flags & 2) == 0) {
            in_RSI[local_20].argument = (char *)0x0;
            in_RSI[local_20].flags = in_RSI[local_20].flags | 0x40;
          }
          else {
            local_1c = 0x80;
          }
        }
        else {
          in_RSI[local_20].argument = pcVar2 + 1;
          in_RSI[local_20].flags = in_RSI[local_20].flags | 0x80;
        }
      }
      else if ((**(char **)(in_RDI + (ulong)local_24 * 8) == '-') &&
              (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + 1) != '\0')) {
        for (local_28 = 1;
            *(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)local_28) != '\0';
            local_28 = local_28 + 1) {
          local_20 = short_option_get_index
                               (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)local_28)
                                ,in_RSI);
          in_RSI[local_20].count = in_RSI[local_20].count + 1;
          if ((in_RSI[local_20].flags & 0x100) != 0) {
            if (in_RSI[local_20].short_name == '\0') {
              in_RSI[local_20].short_name =
                   *(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)local_28);
            }
            if (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)(local_28 + 1)) == '\0')
            {
              in_RSI[local_20].argument = (char *)0x0;
              in_RSI[local_20].flags = in_RSI[local_20].flags | 0x10;
            }
            else {
              in_RSI[local_20].argument =
                   (char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)(local_28 + 1));
              in_RSI[local_20].flags = in_RSI[local_20].flags | 0x20;
            }
            break;
          }
          if ((in_RSI[local_20].flags & 1) == 0) {
            if (*(char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)(local_28 + 1)) != '\0')
            {
              in_RSI[local_20].argument =
                   (char *)(*(long *)(in_RDI + (ulong)local_24 * 8) + (ulong)(local_28 + 1));
              in_RSI[local_20].flags = in_RSI[local_20].flags | 0x20;
              break;
            }
            if ((in_RSI[local_20].flags & 2) == 0) {
              in_RSI[local_20].argument = (char *)0x0;
              in_RSI[local_20].flags = in_RSI[local_20].flags | 0x10;
            }
            else {
              local_1c = 0x20;
            }
          }
          else {
            in_RSI[local_20].argument = (char *)0x0;
            in_RSI[local_20].flags = in_RSI[local_20].flags | 0x10;
          }
        }
      }
      else {
        *(undefined8 *)(in_RDI + (ulong)local_14 * 8) =
             *(undefined8 *)(in_RDI + (ulong)local_24 * 8);
        local_14 = local_14 + 1;
      }
    }
LAB_0010335b:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int gopt (char **argv, struct option *options)
{
  unsigned int operand_count = 1;
  unsigned int doubledash    = 0;
  unsigned int expecting     = 0;
  unsigned int option_index  = 0;
  unsigned int i, j;

  for (i = 0; !(options[i].flags & GOPT_LAST); i++)
  {
    options[i].argument = NULL;
    options[i].count    = 0;
  }

  options[i].short_name = 0;
  options[i].long_name  = NULL;
  options[i].argument   = NULL;
  options[i].count      = 0;

  for (i = 1; argv[i]; i++)
  {
    if (doubledash)
    {
      argv[operand_count] = argv[i];
      operand_count++;
      continue;
    }

    if (expecting)
    {
      if ((argv[i][0] != '-') || !argv[i][1] || !(options[option_index].flags & GOPT_ARGUMENT_NO_HYPHEN))
      {
        options[option_index].flags    |= expecting;
        options[option_index].argument  = argv[i];
        expecting = 0;
        continue;
      }
      else
      {
        options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
        options[option_index].argument  =  NULL;
        expecting = 0;
      }
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-') && (argv[i][2] == 0))
    {
      doubledash = 1;
      continue;
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-'))
    {
      char *eq = strchr (&argv[i][2], '=');

      option_index = long_option_get_index (&argv[i][2], options);

      options[option_index].count++;

      if ((options[option_index].flags & GOPT_LAST) && !options[option_index].long_name)
      {
        options[option_index].long_name = &argv[i][2];
      }

      if (eq)
      {
        options[option_index].argument  = (eq + 1);
        options[option_index].flags    |= GOPT_SEEN_LONG_WITH;
      }
      else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
      {
        expecting = GOPT_SEEN_LONG_WITH;
      }
      else
      {
        options[option_index].argument  = NULL;
        options[option_index].flags    |= GOPT_SEEN_LONG_WITHOUT;
      }
    }
    else if ((argv[i][0] == '-') && argv[i][1])
    {
      for (j = 1; argv[i][j]; j++)
      {
        option_index = short_option_get_index (argv[i][j], options);

        options[option_index].count++;

        if (options[option_index].flags & GOPT_LAST)
        {
          if (!options[option_index].short_name)
          {
            options[option_index].short_name = argv[i][j];
          }

          if (argv[i][j+1])
          {
            options[option_index].argument  = &argv[i][j+1];
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          }
          else
          {
            options[option_index].argument  = NULL;
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
          }
          break;
        }

        if (options[option_index].flags & GOPT_ARGUMENT_FORBIDDEN)
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }

        else if (argv[i][j+1])
        {
          options[option_index].argument  = &argv[i][j+1];
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          break;
        }

        else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
        {
          expecting = GOPT_SEEN_SHORT_WITH;
        }

        else
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }
      }
    }
    else
    {
      argv[operand_count] = argv[i];
      operand_count++;
    }
  }

  if (expecting)
  {
    options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
    options[option_index].argument  =  NULL;
  }

  argv[operand_count] = NULL;
  return operand_count;
}